

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O2

int flushsocket(SOCKET sock)

{
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  timeval local_4c8;
  fd_set sock_set;
  char recvbuf [1024];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    sock_set.fds_bits[lVar2] = 0;
  }
  sock_set.fds_bits[sock / 0x40] = sock_set.fds_bits[sock / 0x40] | 1L << ((byte)sock & 0x3f);
  do {
    local_4c8.tv_usec = 0;
    local_4c8.tv_sec = 0;
    iVar1 = select(sock + 1,(fd_set *)&sock_set,(fd_set *)0x0,(fd_set *)0x0,&local_4c8);
    if (iVar1 < 1) {
      return (uint)(iVar1 == -1);
    }
    sVar3 = recv(sock,recvbuf,0x400,0);
  } while (0 < sVar3);
  return 1;
}

Assistant:

inline int flushsocket(SOCKET sock)
{
	fd_set sock_set;
	struct timeval timeout = {0, 0}; // Timeout of 0 s for select().
	int iResult = SOCKET_ERROR;
	char recvbuf[1024];

	// Initialize a fd_set and add the socket to it.
	FD_ZERO(&sock_set); 
	FD_SET(sock, &sock_set);

	// Check the readability of the socket in the fd_set.
	iResult = select((int)sock+1, &sock_set, NULL, NULL, &timeout);

	while (iResult > 0)
	{
		// There is some data on the socket.
		if (recv(sock, recvbuf, 1024*sizeof(char), 0) <= 0)
		{
			PRINT_DEBUG_ERROR_OSNET(("flushsocket error (%s) : %s(sock=%d)\n", 
				strtime_m(), 
				"recv failed or timed out. ", 
				(int)sock));
			FD_CLR(sock, &sock_set); 
			return EXIT_FAILURE;
		}
		// Reset timeout (because a previous call to select may have modified it).
		timeout.tv_sec = 0;
		timeout.tv_usec = 0;
		// Check the readability of the socket in the fd_set.
		iResult = select((int)sock+1, &sock_set, NULL, NULL, &timeout);
	}

	// Remove the socket from the set.
	FD_CLR(sock, &sock_set); 

	if (iResult == SOCKET_ERROR)
	{
		PRINT_DEBUG_ERROR_OSNET(("flushsocket error (%s) : %s(sock=%d)\n", 
			strtime_m(), 
			"select failed. ", 
			(int)sock));
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}